

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_constructor
                  (JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int classid)

{
  JSValue val;
  JSValue val_00;
  JSValue buffer_00;
  JSValue ctor;
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  JSContext *in_RDI;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar5;
  int in_stack_0000000c;
  JSContext *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined1 in_stack_00000028 [16];
  JSObject *p;
  int in_stack_0000003c;
  JSContext *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  uint64_t offset;
  uint64_t len;
  int size_log2;
  JSArrayBuffer *abuf;
  JSValue obj;
  JSValue buffer;
  uint64_t in_stack_ffffffffffffff28;
  JSContext *in_stack_ffffffffffffff30;
  JSValue in_stack_ffffffffffffff38;
  uint64_t *plen;
  JSContext *in_stack_ffffffffffffff48;
  JSValueUnion JVar6;
  JSValueUnion in_stack_ffffffffffffff50;
  JSContext *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int64_t in_stack_ffffffffffffff68;
  JSValue in_stack_ffffffffffffff70;
  ulong local_80;
  long local_78;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  uint *puVar7;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion local_10;
  int64_t local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  plen = (uint64_t *)in_stack_ffffffffffffff38.tag;
  uVar2 = (uint)""[in_R9D + -0x15];
  lVar1 = local_10;
  if ((int)in_R8->tag == -1) {
    in_stack_ffffffffffffff58 = (JSContext *)(in_R8->u).ptr;
    if (((in_stack_ffffffffffffff58->header).dummy2 != 0x13) &&
       ((in_stack_ffffffffffffff58->header).dummy2 != 0x14)) {
      if ((0x14 < (in_stack_ffffffffffffff58->header).dummy2) &&
         ((in_stack_ffffffffffffff58->header).dummy2 < 0x1e)) {
        JVar5 = js_typed_array_constructor_ta
                          (in_stack_00000040,_offset,(JSValue)in_stack_00000048,in_stack_0000003c);
        return JVar5;
      }
      JVar5 = js_typed_array_constructor_obj
                        (in_stack_00000010,(JSValue)in_stack_00000028,(JSValue)in_stack_00000018,
                         in_stack_0000000c);
      return JVar5;
    }
    puVar7 = *(uint **)&in_stack_ffffffffffffff58->binary_object_count;
    JVar5.tag = (int64_t)in_stack_ffffffffffffff58;
    JVar5.u.ptr = in_stack_ffffffffffffff50.ptr;
    iVar4 = JS_ToIndex(in_stack_ffffffffffffff48,plen,JVar5);
    if (iVar4 != 0) {
      local_10.ptr = (void *)(lVar1 << 0x20);
      local_8 = 6;
      return _local_10;
    }
    if ((char)puVar7[1] != '\0') {
      JVar5 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x150911);
      return JVar5;
    }
    if (((local_80 & (long)((1 << ((byte)uVar2 & 0x1f)) + -1)) != 0) ||
       ((ulong)(long)(int)*puVar7 < local_80)) {
      JVar5 = JS_ThrowRangeError(in_RDI,"invalid offset");
      return JVar5;
    }
    iVar4 = JS_IsUndefined(in_R8[2]);
    if (iVar4 == 0) {
      val_00.tag = (int64_t)in_stack_ffffffffffffff58;
      val_00.u.ptr = in_stack_ffffffffffffff50.ptr;
      iVar4 = JS_ToIndex(in_stack_ffffffffffffff48,plen,val_00);
      if (iVar4 != 0) {
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
        return _local_10;
      }
      if ((char)puVar7[1] != '\0') {
        JVar5 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x150a3a);
        return JVar5;
      }
      if (local_80 + (local_78 << ((byte)uVar2 & 0x3f)) <= (ulong)(long)(int)*puVar7)
      goto LAB_00150aa2;
    }
    else if ((*puVar7 & (1 << ((byte)uVar2 & 0x1f)) - 1U) == 0) {
LAB_00150aa2:
      iVar4 = (int)((ulong)puVar7 >> 0x20);
      JVar5 = JS_DupValue(in_RDI,*in_R8);
      JVar6 = JVar5.u;
      in_stack_ffffffffffffff50 = (JSValueUnion)JVar5.tag;
      goto LAB_00150b97;
    }
    _local_10 = JS_ThrowRangeError(in_RDI,"invalid length");
  }
  else {
    val.tag = (int64_t)in_stack_ffffffffffffff58;
    val.u.ptr = in_stack_ffffffffffffff50.ptr;
    iVar3 = JS_ToIndex(in_stack_ffffffffffffff48,plen,val);
    if (iVar3 != 0) {
      local_10.ptr = (void *)(lVar1 << 0x20);
      local_8 = 6;
      return _local_10;
    }
    in_stack_ffffffffffffff60 = 0;
    in_stack_ffffffffffffff68 = 3;
    in_stack_ffffffffffffff70 =
         js_array_buffer_constructor1
                   (in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff28);
    JVar6 = in_stack_ffffffffffffff70.u;
    iVar3 = JS_IsException(in_stack_ffffffffffffff70);
    if (iVar3 != 0) {
      local_10.ptr = (void *)(lVar1 << 0x20);
      local_8 = 6;
      return _local_10;
    }
LAB_00150b97:
    ctor.tag = (int64_t)JVar6.ptr;
    ctor.u.float64 = in_stack_ffffffffffffffa8.float64;
    JVar5 = js_create_from_ctor(in_stack_ffffffffffffffa0,ctor,iVar4);
    local_10 = JVar5.u;
    local_8 = JVar5.tag;
    iVar4 = JS_IsException(JVar5);
    if (iVar4 == 0) {
      buffer_00.u._4_4_ = in_stack_ffffffffffffff64;
      buffer_00.u.int32 = in_stack_ffffffffffffff60;
      buffer_00.tag = in_stack_ffffffffffffff68;
      iVar4 = typed_array_init(in_stack_ffffffffffffff58,in_stack_ffffffffffffff70,buffer_00,
                               (uint64_t)in_stack_ffffffffffffff50,
                               CONCAT44(uVar2,in_stack_ffffffffffffff90));
      if (iVar4 == 0) {
      }
      else {
        JS_FreeValue(in_stack_ffffffffffffff30,JVar5);
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
      }
    }
    else {
      JS_FreeValue(in_stack_ffffffffffffff30,JVar5);
      local_10.ptr = (void *)(lVar1 << 0x20);
      local_8 = 6;
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_typed_array_constructor(JSContext *ctx,
                                          JSValueConst new_target,
                                          int argc, JSValueConst *argv,
                                          int classid)
{
    JSValue buffer, obj;
    JSArrayBuffer *abuf;
    int size_log2;
    uint64_t len, offset;

    size_log2 = typed_array_size_log2(classid);
    if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT) {
        if (JS_ToIndex(ctx, &len, argv[0]))
            return JS_EXCEPTION;
        buffer = js_array_buffer_constructor1(ctx, JS_UNDEFINED,
                                              len << size_log2);
        if (JS_IsException(buffer))
            return JS_EXCEPTION;
        offset = 0;
    } else {
        JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
        if (p->class_id == JS_CLASS_ARRAY_BUFFER ||
            p->class_id == JS_CLASS_SHARED_ARRAY_BUFFER) {
            abuf = p->u.array_buffer;
            if (JS_ToIndex(ctx, &offset, argv[1]))
                return JS_EXCEPTION;
            if (abuf->detached)
                return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            if ((offset & ((1 << size_log2) - 1)) != 0 ||
                offset > abuf->byte_length)
                return JS_ThrowRangeError(ctx, "invalid offset");
            if (JS_IsUndefined(argv[2])) {
                if ((abuf->byte_length & ((1 << size_log2) - 1)) != 0)
                    goto invalid_length;
                len = (abuf->byte_length - offset) >> size_log2;
            } else {
                if (JS_ToIndex(ctx, &len, argv[2]))
                    return JS_EXCEPTION;
                if (abuf->detached)
                    return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
                if ((offset + (len << size_log2)) > abuf->byte_length) {
                invalid_length:
                    return JS_ThrowRangeError(ctx, "invalid length");
                }
            }
            buffer = JS_DupValue(ctx, argv[0]);
        } else {
            if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                return js_typed_array_constructor_ta(ctx, new_target, argv[0], classid);
            } else {
                return js_typed_array_constructor_obj(ctx, new_target, argv[0], classid);
            }
        }
    }

    obj = js_create_from_ctor(ctx, new_target, classid);
    if (JS_IsException(obj)) {
        JS_FreeValue(ctx, buffer);
        return JS_EXCEPTION;
    }
    if (typed_array_init(ctx, obj, buffer, offset, len)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    return obj;
}